

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstring.cpp
# Opt level: O3

SQInteger sqstd_register_stringlib(HSQUIRRELVM v)

{
  SQInteger SVar1;
  long lVar2;
  char *s;
  SQChar *s_00;
  
  sq_pushstring(v,"regexp",-1);
  sq_newclass(v,0);
  s = "constructor";
  lVar2 = 0x20;
  do {
    sq_pushstring(v,s,-1);
    SVar1 = *(SQInteger *)((long)&_stream_methods[10].nparamscheck + lVar2);
    sq_newclosure(v,*(SQFUNCTION *)((long)&_stream_methods[10].f + lVar2),0);
    sq_setparamscheck(v,SVar1,*(SQChar **)((long)&_stream_methods[10].typemask + lVar2));
    sq_setnativeclosurename(v,-1,s);
    sq_newslot(v,-3,0);
    s = *(char **)((long)&rexobj_funcs[0].name + lVar2);
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0xe0);
  sq_newslot(v,-3,0);
  s_00 = "format";
  lVar2 = 0x20;
  do {
    sq_pushstring(v,s_00,-1);
    SVar1 = *(SQInteger *)((long)&rexobj_funcs[6].nparamscheck + lVar2);
    sq_newclosure(v,*(SQFUNCTION *)((long)&rexobj_funcs[6].f + lVar2),0);
    sq_setparamscheck(v,SVar1,*(SQChar **)((long)&rexobj_funcs[6].typemask + lVar2));
    sq_setnativeclosurename(v,-1,s_00);
    sq_newslot(v,-3,0);
    s_00 = *(SQChar **)((long)&stringlib_funcs[0].name + lVar2);
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x140);
  return 1;
}

Assistant:

SQInteger sqstd_register_stringlib(HSQUIRRELVM v)
{
    sq_pushstring(v,_SC("regexp"),-1);
    sq_newclass(v,SQFalse);
    SQInteger i = 0;
    while(rexobj_funcs[i].name != 0) {
        const SQRegFunction &f = rexobj_funcs[i];
        sq_pushstring(v,f.name,-1);
        sq_newclosure(v,f.f,0);
        sq_setparamscheck(v,f.nparamscheck,f.typemask);
        sq_setnativeclosurename(v,-1,f.name);
        sq_newslot(v,-3,SQFalse);
        i++;
    }
    sq_newslot(v,-3,SQFalse);

    i = 0;
    while(stringlib_funcs[i].name!=0)
    {
        sq_pushstring(v,stringlib_funcs[i].name,-1);
        sq_newclosure(v,stringlib_funcs[i].f,0);
        sq_setparamscheck(v,stringlib_funcs[i].nparamscheck,stringlib_funcs[i].typemask);
        sq_setnativeclosurename(v,-1,stringlib_funcs[i].name);
        sq_newslot(v,-3,SQFalse);
        i++;
    }
    return 1;
}